

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O3

void Ndr_NtkPrintNodes(Wlc_Ntk_t *pNtk)

{
  Wlc_Obj_t *pWVar1;
  ushort uVar2;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  puts("Node IDs and their fanins:");
  if (1 < pNtk->iObj) {
    uVar7 = 1;
    do {
      if ((long)pNtk->nObjsAlloc <= (long)uVar7) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = pNtk->pObjs + uVar7;
      if ((pWVar1->nFanins < 3) && ((*(uint *)pWVar1 & 0x3f | 0x10) != 0x16)) {
        paVar3 = &pWVar1->field_10;
      }
      else {
        paVar3 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
      }
      uVar6 = 0;
      printf("%5d = ",uVar7 & 0xffffffff);
      if ((int)pWVar1->nFanins < 1) {
LAB_00342b0f:
        iVar4 = (int)uVar6 + -4;
        do {
          printf("      ");
          iVar4 = iVar4 + 1;
        } while (iVar4 != 0);
      }
      else {
        uVar6 = 0;
        do {
          uVar5 = uVar6;
          printf("%5d ",(ulong)(uint)paVar3->Fanins[uVar5]);
          uVar6 = uVar5 + 1;
        } while ((long)uVar6 < (long)(int)pWVar1->nFanins);
        if (uVar5 < 3) goto LAB_00342b0f;
      }
      if ((long)(pNtk->vNameIds).nSize <= (long)uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("    Name Id %d ",(ulong)(uint)(pNtk->vNameIds).pArray[uVar7]);
      uVar2 = *(ushort *)pWVar1;
      if ((uVar2 & 0x3f) == 1) {
        printf("  pi  ");
        uVar2 = *(ushort *)pWVar1;
      }
      if ((uVar2 >> 9 & 1) != 0) {
        printf("  po  ");
      }
      putchar(10);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)pNtk->iObj);
  }
  return;
}

Assistant:

void Ndr_NtkPrintNodes( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj; int i, k;
    printf( "Node IDs and their fanins:\n" );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        int * pFanins = Wlc_ObjFanins(pObj);
        printf( "%5d = ", i );
        for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
            printf( "%5d ", pFanins[k] );
        for (      ; k < 4; k++ )
            printf( "      " );
        printf( "    Name Id %d ", Wlc_ObjNameId(pNtk, i) );
        if ( Wlc_ObjIsPi(pObj) )
            printf( "  pi  " );
        if ( Wlc_ObjIsPo(pObj) )
            printf( "  po  " );
        printf( "\n" );
    }
}